

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voting.cpp
# Opt level: O3

void __thiscall CVoting::CallvoteSpectate(CVoting *this,int ClientID,char *pReason,bool ForceVote)

{
  undefined7 in_register_00000009;
  long in_FS_OFFSET;
  char aBuf [32];
  CNetMsg_Cl_CallVote local_68;
  char local_48 [32];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  str_format(local_48,0x20,"%d",ClientID);
  local_68.m_Type = "spectate";
  local_68._24_8_ = CONCAT71(in_register_00000009,ForceVote) & 0xffffffff;
  local_68.m_Value = local_48;
  local_68.m_Reason = pReason;
  IClient::SendPackMsg<CNetMsg_Cl_CallVote>
            (((this->super_CComponent).m_pClient)->m_pClient,&local_68,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CVoting::CallvoteSpectate(int ClientID, const char *pReason, bool ForceVote)
{
	char aBuf[32];
	str_format(aBuf, sizeof(aBuf), "%d", ClientID);
	Callvote("spectate", aBuf, pReason, ForceVote);
}